

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O0

xml_attribute __thiscall
pugi::xml_node::find_attribute<pugi::impl::(anonymous_namespace)::namespace_uri_predicate>
          (xml_node *this,namespace_uri_predicate pred)

{
  bool bVar1;
  unspecified_bool_type p_Var2;
  xml_node *this_local;
  namespace_uri_predicate pred_local;
  xml_attribute attrib;
  
  pred_local.prefix = (char_t *)pred.prefix_length;
  this_local = (xml_node *)pred.prefix;
  if (this->_root == (xml_node_struct *)0x0) {
    xml_attribute::xml_attribute((xml_attribute *)&pred_local.prefix_length);
  }
  else {
    pred_local.prefix_length = (size_t)first_attribute(this);
    while (p_Var2 = xml_attribute::operator_cast_to_function_pointer
                              ((xml_attribute *)&pred_local.prefix_length),
          p_Var2 != (unspecified_bool_type)0x0) {
      bVar1 = impl::anon_unknown_0::namespace_uri_predicate::operator()
                        ((namespace_uri_predicate *)&this_local,
                         (xml_attribute)pred_local.prefix_length);
      if (bVar1) {
        return (xml_attribute)(xml_attribute_struct *)pred_local.prefix_length;
      }
      pred_local.prefix_length =
           (size_t)xml_attribute::next_attribute((xml_attribute *)&pred_local.prefix_length);
    }
    xml_attribute::xml_attribute((xml_attribute *)&pred_local.prefix_length);
  }
  return (xml_attribute)(xml_attribute_struct *)pred_local.prefix_length;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}